

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,float,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  const_reference pvVar2;
  idx_t iVar3;
  SelectionVector *pSVar4;
  uint uVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  bool bVar9;
  uchar **rhs_locations;
  SelectionVector *lhs_sel;
  float local_68;
  float local_64;
  data_ptr_t local_60;
  idx_t local_58;
  value_type local_50;
  ulong local_48;
  data_ptr_t local_40;
  SelectionVector *local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_38 = (lhs_format->unified).sel;
  local_60 = (lhs_format->unified).data;
  local_40 = rhs_row_locations->data;
  pvVar2 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  local_48 = col_idx >> 3;
  local_50 = *pvVar2;
  local_58 = count;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar8 = 0;
      iVar7 = 0;
      do {
        iVar6 = iVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)sel->sel_vector[iVar7];
        }
        iVar3 = iVar6;
        if (local_38->sel_vector != (sel_t *)0x0) {
          iVar3 = (idx_t)local_38->sel_vector[iVar6];
        }
        local_68 = *(float *)(*(long *)(local_40 + iVar6 * 8) + local_50);
        bVar9 = (1 << ((byte)col_idx & 7) &
                (uint)*(byte *)(*(long *)(local_40 + iVar6 * 8) + local_48)) != 0;
        if (bVar9) {
          bVar9 = Equals::Operation<float>((float *)(local_60 + iVar3 * 4),&local_68);
          count = local_58;
        }
        if (bVar9 == false) {
          iVar3 = *no_match_count;
          *no_match_count = iVar3 + 1;
          pSVar4 = no_match_sel;
        }
        else {
          iVar3 = iVar8;
          pSVar4 = sel;
          iVar8 = iVar8 + 1;
        }
        pSVar4->sel_vector[iVar3] = (sel_t)iVar6;
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
      return iVar8;
    }
  }
  else if (count != 0) {
    iVar8 = 0;
    iVar7 = 0;
    do {
      iVar6 = iVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)sel->sel_vector[iVar7];
      }
      iVar3 = iVar6;
      if (local_38->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)local_38->sel_vector[iVar6];
      }
      puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar9 = false;
      }
      else {
        bVar9 = (puVar1[iVar3 >> 6] >> (iVar3 & 0x3f) & 1) == 0;
      }
      uVar5 = (uint)*(byte *)(*(long *)(local_40 + iVar6 * 8) + local_48) & 1 << ((byte)col_idx & 7)
      ;
      local_64 = *(float *)(*(long *)(local_40 + iVar6 * 8) + local_50);
      if ((bVar9 == false) && (uVar5 != 0)) {
        bVar9 = Equals::Operation<float>((float *)(local_60 + iVar3 * 4),&local_64);
        count = local_58;
      }
      else {
        bVar9 = (bool)(bVar9 ^ uVar5 == 0 ^ 1);
      }
      if (bVar9 == false) {
        iVar3 = *no_match_count;
        *no_match_count = iVar3 + 1;
        pSVar4 = no_match_sel;
      }
      else {
        iVar3 = iVar8;
        pSVar4 = sel;
        iVar8 = iVar8 + 1;
      }
      pSVar4->sel_vector[iVar3] = (sel_t)iVar6;
      iVar7 = iVar7 + 1;
    } while (count != iVar7);
    return iVar8;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}